

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O1

void __thiscall
ser::CentralizedFileFormat::Init
          (CentralizedFileFormat *this,string *directory,string *prefix,MetainfoSet *globalMetainfo,
          FieldsTable *fieldsTable,OffsetTable *offsetTable)

{
  long *plVar1;
  long *plVar2;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  FileFormat::Init(&this->super_FileFormat,directory,prefix,globalMetainfo,fieldsTable,offsetTable);
  std::operator+(&local_38,&(this->super_FileFormat).directory_,&(this->super_FileFormat).prefix_);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  local_50 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->databaseFile_,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CentralizedFileFormat::Init(const std::string& directory, const std::string& prefix,
                                 MetainfoSet& globalMetainfo, FieldsTable& fieldsTable, OffsetTable& offsetTable)
{
    FileFormat::Init(directory, prefix, globalMetainfo, fieldsTable, offsetTable);
    databaseFile_ = directory_ + prefix_ + ".json";
}